

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O3

int run_server(sockaddr *sa,socklen_t salen,ptls_context_t *ctx,ptls_handshake_properties_t *hsprop)

{
  int __fd;
  int iVar1;
  char *__s;
  int on;
  undefined4 local_2c;
  
  local_2c = 1;
  __fd = socket(2,1,0);
  if (__fd == -1) {
    __s = "socket(2) failed";
  }
  else {
    iVar1 = setsockopt(__fd,1,2,&local_2c,4);
    if (iVar1 == 0) {
      iVar1 = bind(__fd,(sockaddr *)sa,salen);
      if (iVar1 == 0) {
        iVar1 = listen(__fd,0x1000);
        if (iVar1 == 0) {
          do {
            do {
              iVar1 = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0);
            } while (iVar1 == -1);
            handle_connection(iVar1,ctx,(char *)0x0,hsprop);
            close(iVar1);
          } while( true );
        }
        __s = "listen(2) failed";
      }
      else {
        __s = "bind(2) failed";
      }
    }
    else {
      __s = "setsockopt(SO_REUSEADDR) failed";
    }
  }
  perror(__s);
  return 1;
}

Assistant:

static int run_server(struct sockaddr *sa, socklen_t salen, ptls_context_t *ctx, ptls_handshake_properties_t *hsprop)
{
    int listen_fd, conn_fd, on = 1;

    if ((listen_fd = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
        perror("socket(2) failed");
        return 1;
    }
    if (setsockopt(listen_fd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on)) != 0) {
        perror("setsockopt(SO_REUSEADDR) failed");
        return 1;
    }
    if (bind(listen_fd, sa, salen) != 0) {
        perror("bind(2) failed");
        return 1;
    }
    if (listen(listen_fd, SOMAXCONN) != 0) {
        perror("listen(2) failed");
        return 1;
    }

    while (1) {
        if ((conn_fd = accept(listen_fd, NULL, 0)) != -1) {
            handle_connection(conn_fd, ctx, NULL, hsprop);
            close(conn_fd);
        }
    }

    return 0;
}